

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quantile.cpp
# Opt level: O3

AggregateFunction * __thiscall
duckdb::ListDiscreteQuantile::GetFunction<float,duckdb::QuantileStandardType>
          (AggregateFunction *__return_storage_ptr__,ListDiscreteQuantile *this,LogicalType *type)

{
  initializer_list<duckdb::LogicalType> __l;
  LogicalType result_type;
  allocator_type local_59;
  LogicalType local_58 [24];
  vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_> local_40;
  LogicalType local_28 [24];
  
  duckdb::LogicalType::LIST(local_28);
  duckdb::LogicalType::LogicalType(local_58,(LogicalType *)this);
  __l._M_len = 1;
  __l._M_array = local_58;
  std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::vector
            (&local_40,__l,&local_59);
  AggregateFunction::AggregateFunction
            (__return_storage_ptr__,(vector<duckdb::LogicalType,_true> *)&local_40,local_28,
             AggregateFunction::StateSize<duckdb::QuantileState<float,duckdb::QuantileStandardType>>
             ,AggregateFunction::
              StateInitialize<duckdb::QuantileState<float,duckdb::QuantileStandardType>,duckdb::QuantileListOperation<float,true>,(duckdb::AggregateDestructorType)1>
             ,AggregateFunction::
              UnaryScatterUpdate<duckdb::QuantileState<float,duckdb::QuantileStandardType>,float,duckdb::QuantileListOperation<float,true>>
             ,AggregateFunction::
              StateCombine<duckdb::QuantileState<float,duckdb::QuantileStandardType>,duckdb::QuantileListOperation<float,true>>
             ,AggregateFunction::
              StateFinalize<duckdb::QuantileState<float,duckdb::QuantileStandardType>,duckdb::list_entry_t,duckdb::QuantileListOperation<float,true>>
             ,AggregateFunction::
              UnaryUpdate<duckdb::QuantileState<float,duckdb::QuantileStandardType>,float,duckdb::QuantileListOperation<float,true>>
             ,(bind_aggregate_function_t)0x0,
             AggregateFunction::
             StateDestroy<duckdb::QuantileState<float,duckdb::QuantileStandardType>,duckdb::QuantileListOperation<float,true>>
             ,(aggregate_statistics_t)0x0,(aggregate_window_t)0x0,(aggregate_serialize_t)0x0,
             (aggregate_deserialize_t)0x0);
  std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::~vector(&local_40);
  duckdb::LogicalType::~LogicalType(local_58);
  duckdb::LogicalType::~LogicalType(local_28);
  __return_storage_ptr__->order_dependent = NOT_ORDER_DEPENDENT;
  __return_storage_ptr__->window =
       QuantileListOperation<float,true>::
       Window<duckdb::QuantileState<float,duckdb::QuantileStandardType>,float,duckdb::list_entry_t>;
  __return_storage_ptr__->window_init =
       QuantileOperation::
       WindowInit<duckdb::QuantileState<float,duckdb::QuantileStandardType>,float>;
  return __return_storage_ptr__;
}

Assistant:

static AggregateFunction GetFunction(const LogicalType &type) {
		using STATE = QuantileState<INPUT_TYPE, TYPE_OP>;
		using OP = QuantileListOperation<INPUT_TYPE, true>;
		auto fun = QuantileListAggregate<STATE, INPUT_TYPE, list_entry_t, OP>(type, type);
		fun.order_dependent = AggregateOrderDependent::NOT_ORDER_DEPENDENT;
#ifndef DUCKDB_SMALLER_BINARY
		fun.window = OP::template Window<STATE, INPUT_TYPE, list_entry_t>;
		fun.window_init = OP::template WindowInit<STATE, INPUT_TYPE>;
#endif
		return fun;
	}